

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O2

void __thiscall Ptex::v2_2::StringKey::StringKey(StringKey *this,char *val)

{
  uint32_t uVar1;
  size_t sVar2;
  
  this->_val = val;
  sVar2 = strlen(val);
  this->_len = (uint32_t)sVar2;
  uVar1 = memHash(this->_val,this->_len);
  this->_hash = uVar1;
  this->_ownsVal = false;
  return;
}

Assistant:

StringKey(const char* val)
    {
        _val = val;
        _len = uint32_t(strlen(val));
        _hash = memHash(_val, _len);
        _ownsVal = false;
    }